

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::doPendingFuntors(EventLoop *this)

{
  _Any_data *p_Var1;
  pointer pfVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined1 auVar5 [8];
  undefined1 auStack_38 [8];
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  
  auStack_38 = (undefined1  [8])0x0;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  p_Var1 = (_Any_data *)
           (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar3 = (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_38;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_38 = (undefined1  [8])p_Var1;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar2;
  functors.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  pfVar2 = functors.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  auVar5 = auStack_38;
  while( true ) {
    if (auVar5 == (undefined1  [8])pfVar2) {
      this->callingPendingFunctors_ = false;
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                 auStack_38);
      return;
    }
    if (*(long *)((long)auVar5 + 0x10) == 0) break;
    (**(code **)((long)auVar5 + 0x18))((_Any_data *)auVar5);
    auVar5 = (undefined1  [8])((long)auVar5 + 0x20);
  }
  uVar4 = std::__throw_bad_function_call();
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)auStack_38)
  ;
  _Unwind_Resume(uVar4);
}

Assistant:

void EventLoop::doPendingFuntors() {
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;
    
    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFuntors_);
    }

    for(const Functor& functor : functors) {
        functor();
    }

    callingPendingFunctors_ = false;
}